

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_SimRsbTfo_rec(Gia_Man_t *p,int iObj,int iFanout,Vec_Int_t *vTfo)

{
  uint uVar1;
  int iObj_00;
  int *piVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  int iVar5;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    return;
  }
  p->pTravIds[iObj] = p->nTravIds;
  if ((-1 < iObj) && (pVVar3 = p->vFanoutNums, iObj < pVVar3->nSize)) {
    iVar5 = 0;
    while( true ) {
      if (pVVar3->pArray[(uint)iObj] <= iVar5) {
        Vec_IntPush(vTfo,iObj);
        return;
      }
      uVar1 = p->vFanout->nSize;
      if ((int)uVar1 <= iObj) break;
      piVar2 = p->vFanout->pArray;
      uVar4 = piVar2[(uint)iObj] + iVar5;
      if (((int)uVar4 < 0) || (uVar1 <= uVar4)) break;
      iObj_00 = piVar2[uVar4];
      if ((iFanout == -1) || (iObj_00 == iFanout)) {
        Gia_SimRsbTfo_rec(p,iObj_00,-1,vTfo);
      }
      iVar5 = iVar5 + 1;
      pVVar3 = p->vFanoutNums;
      if (pVVar3->nSize <= iObj) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_SimRsbTfo_rec( Gia_Man_t * p, int iObj, int iFanout, Vec_Int_t * vTfo )
{
    int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        if ( iFanout == -1 || iFan == iFanout )
            Gia_SimRsbTfo_rec( p, iFan, -1, vTfo );
    Vec_IntPush( vTfo, iObj );
}